

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<QString,ProStringList>>::
emplace<std::pair<QString,ProStringList>>
          (QMovableArrayOps<std::pair<QString,ProStringList>> *this,qsizetype i,
          pair<QString,_ProStringList> *args)

{
  long lVar1;
  qsizetype qVar2;
  long in_FS_OFFSET;
  Inserter local_80;
  pair<QString,_ProStringList> local_58;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(int **)this != (int *)0x0) && (**(int **)this < 2)) {
    if (*(long *)(this + 0x10) == i) {
      qVar2 = QArrayDataPointer<std::pair<QString,_ProStringList>_>::freeSpaceAtEnd
                        ((QArrayDataPointer<std::pair<QString,_ProStringList>_> *)this);
      if (qVar2 == 0) goto LAB_001d173d;
      std::pair<QString,_ProStringList>::pair
                ((pair<QString,_ProStringList> *)
                 (*(long *)(this + 0x10) * 0x30 + *(long *)(this + 8)),args);
LAB_001d182c:
      *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
      goto LAB_001d17eb;
    }
LAB_001d173d:
    if (i == 0) {
      qVar2 = QArrayDataPointer<std::pair<QString,_ProStringList>_>::freeSpaceAtBegin
                        ((QArrayDataPointer<std::pair<QString,_ProStringList>_> *)this);
      if (qVar2 != 0) {
        std::pair<QString,_ProStringList>::pair
                  ((pair<QString,_ProStringList> *)(*(long *)(this + 8) + -0x30),args);
        *(long *)(this + 8) = *(long *)(this + 8) + -0x30;
        goto LAB_001d182c;
      }
    }
  }
  local_58.second.super_QList<ProString>.d.ptr = (ProString *)0xaaaaaaaaaaaaaaaa;
  local_58.second.super_QList<ProString>.d.size = -0x5555555555555556;
  local_58.first.d.size = -0x5555555555555556;
  local_58.second.super_QList<ProString>.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_58.first.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_58.first.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  std::pair<QString,_ProStringList>::pair(&local_58,args);
  lVar1 = *(long *)(this + 0x10);
  QArrayDataPointer<std::pair<QString,_ProStringList>_>::detachAndGrow
            ((QArrayDataPointer<std::pair<QString,_ProStringList>_> *)this,
             (uint)(i == 0 && lVar1 != 0),1,(pair<QString,_ProStringList> **)0x0,
             (QArrayDataPointer<std::pair<QString,_ProStringList>_> *)0x0);
  if (i == 0 && lVar1 != 0) {
    std::pair<QString,_ProStringList>::pair
              ((pair<QString,_ProStringList> *)(*(long *)(this + 8) + -0x30),&local_58);
    *(long *)(this + 8) = *(long *)(this + 8) + -0x30;
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  }
  else {
    QMovableArrayOps<std::pair<QString,_ProStringList>_>::Inserter::Inserter
              (&local_80,(QArrayDataPointer<std::pair<QString,_ProStringList>_> *)this,i,1);
    std::pair<QString,_ProStringList>::pair(local_80.displaceFrom,&local_58);
    local_80.displaceFrom = local_80.displaceFrom + 1;
    (local_80.data)->size = (local_80.data)->size + local_80.nInserts;
  }
  std::pair<QString,_ProStringList>::~pair(&local_58);
LAB_001d17eb:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }